

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O3

void __thiscall QHttpSocketEngine::slotSocketConnected(QHttpSocketEngine *this)

{
  long lVar1;
  QAuthenticatorPrivate *this_00;
  QStringView host;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  qsizetype qVar5;
  long *plVar6;
  long *plVar7;
  long i;
  long in_FS_OFFSET;
  QByteArrayView requestMethod;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QLatin1StringView QVar13;
  QByteArrayView path;
  QHttpHeaders headers;
  QString local_110;
  qsizetype local_f8;
  storage_type_conflict *psStack_f0;
  QByteArray local_e8;
  QNetworkProxy local_d0;
  QByteArray local_c8;
  QByteArray local_a8;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView>,_const_char_(&)[3]>
  local_70;
  char local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  builtin_strncpy(local_40,"CONNECT",8);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  if (*(long *)(lVar1 + 0xf0) == 0) {
    QHostAddress::toString((QString *)&local_70,(QHostAddress *)(lVar1 + 0xb8));
    QString::toLatin1_helper_inplace((QString *)&local_88);
    if ((QArrayData *)local_70.a.a.a.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_70.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_70.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_70.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate((QArrayData *)local_70.a.a.a.m_size,2,0x10);
      }
    }
  }
  else {
    QUrl::toAce(&local_88,lVar1 + 0xe0,0);
  }
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::number((int)&local_c8,(uint)*(ushort *)(lVar1 + 0xc0));
  local_70.a.b.m_data = (storage_type *)local_c8.d.size;
  local_70.a.b.m_size = (qsizetype)local_c8.d.ptr;
  local_70.a.a.b = (char (*) [3])local_c8.d.d;
  local_70.a.a.a.m_data._0_1_ = 0x3a;
  local_70.a.a.a.m_size = (qsizetype)&local_88;
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char *)0x0;
  local_c8.d.size = 0;
  QStringBuilder<QStringBuilder<QByteArray_&,_char>,_QByteArray>::convertTo<QByteArray>
            (&local_a8,(QStringBuilder<QStringBuilder<QByteArray_&,_char>,_QByteArray> *)&local_70);
  if ((QArrayData *)local_70.a.a.b != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_70.a.a.b)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_70.a.a.b)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_70.a.a.b)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70.a.a.b,1,0x10);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
    }
  }
  local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_c8,local_40,-1);
  QByteArray::append((char)&local_c8);
  QByteArray::append(&local_c8);
  QVar8.m_data = (storage_type *)0xb;
  QVar8.m_size = local_c8.d.size;
  QByteArray::insert((longlong)&local_c8,QVar8);
  QVar9.m_data = (storage_type *)0x1e;
  QVar9.m_size = local_c8.d.size;
  QByteArray::insert((longlong)&local_c8,QVar9);
  local_70.a.a.a.m_data = (storage_type *)&local_88;
  local_70.a.a.a.m_size = (qsizetype)"Host: ";
  local_70.a.a.b = (char (*) [3])0x269eb2;
  QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[7],QByteArray&>,char_const(&)[3]>
            (&local_c8,
             (QStringBuilder<QStringBuilder<const_char_(&)[7],_QByteArray_&>,_const_char_(&)[3]> *)
             &local_70,'\0');
  local_d0.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkProxy::headers(&local_d0);
  bVar4 = QHttpHeaders::contains((QHttpHeaders *)&local_d0,UserAgent);
  if (!bVar4) {
    QVar10.m_data = (storage_type *)0x19;
    QVar10.m_size = local_c8.d.size;
    QByteArray::insert((longlong)&local_c8,QVar10);
  }
  qVar5 = QHttpHeaders::size((QHttpHeaders *)&local_d0);
  if (0 < qVar5) {
    i = 0;
    do {
      QVar13 = QHttpHeaders::nameAt((QHttpHeaders *)&local_d0,i);
      local_70.a.b = QHttpHeaders::valueAt((QHttpHeaders *)&local_d0,i);
      local_70.a.a.b = (char (*) [3])0x27b345;
      local_70.b = (char (*) [3])0x269eb2;
      local_70.a.a.a = (QByteArrayView)QVar13;
      QtStringBuilder::
      appendToByteArray<QStringBuilder<QStringBuilder<QByteArrayView,char_const(&)[3]>,QByteArrayView>,char_const(&)[3]>
                (&local_c8,&local_70,'\0');
      i = i + 1;
      qVar5 = QHttpHeaders::size((QHttpHeaders *)&local_d0);
    } while (i < qVar5);
  }
  this_00 = *(QAuthenticatorPrivate **)(lVar1 + 0x110);
  if ((this_00 != (QAuthenticatorPrivate *)0x0) && (this_00->method != None)) {
    *(undefined1 *)(lVar1 + 0x11e) = 1;
    plVar6 = (long *)memchr(local_40,0,8);
    qVar5 = local_a8.d.size;
    pcVar3 = local_a8.d.ptr;
    plVar7 = &local_38;
    if (plVar6 != (long *)0x0) {
      plVar7 = plVar6;
    }
    QNetworkProxy::hostName(&local_110,(QNetworkProxy *)(lVar1 + 0xd8));
    local_f8 = local_110.d.size;
    psStack_f0 = local_110.d.ptr;
    host.m_data = local_110.d.ptr;
    host.m_size = local_110.d.size;
    requestMethod.m_data = local_40;
    requestMethod.m_size = (long)plVar7 - (long)local_40;
    path.m_data = pcVar3;
    path.m_size = qVar5;
    QAuthenticatorPrivate::calculateResponse(&local_e8,this_00,requestMethod,path,host);
    qVar5 = local_e8.d.size;
    local_70.a.a.b = (char (*) [3])local_e8.d.ptr;
    local_70.a.a.a.m_data = (storage_type *)local_e8.d.d;
    local_e8.d.d = (Data *)0x0;
    local_e8.d.ptr = (char *)0x0;
    local_70.a.a.a.m_size = (qsizetype)"Proxy-Authorization: ";
    local_e8.d.size = 0;
    local_70.a.b.m_size = qVar5;
    QtStringBuilder::appendToByteArray<char_const(&)[22],QByteArray>
              (&local_c8,(QStringBuilder<const_char_(&)[22],_QByteArray> *)&local_70,'\0');
    if ((QArrayData *)local_70.a.a.a.m_data != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_70.a.a.a.m_data)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_70.a.a.a.m_data)->_q_value).super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_70.a.a.a.m_data)->_q_value).super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate((QArrayData *)local_70.a.a.a.m_data,1,0x10);
      }
    }
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_110.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_110.d.d)->super_QArrayData,2,0x10);
      }
    }
    QVar11.m_data = (storage_type *)0x2;
    QVar11.m_size = local_c8.d.size;
    QByteArray::insert((longlong)&local_c8,QVar11);
  }
  QVar12.m_data = (storage_type *)0x2;
  QVar12.m_size = local_c8.d.size;
  QByteArray::insert((longlong)&local_c8,QVar12);
  QIODevice::write(*(QByteArray **)(lVar1 + 0xf8));
  *(undefined4 *)(lVar1 + 0x108) = 1;
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_d0);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
    }
  }
  piVar2 = (int *)CONCAT44(uStack_84,local_88);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_84,local_88),1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpSocketEngine::slotSocketConnected()
{
    Q_D(QHttpSocketEngine);

    // Send the greeting.
    const char method[] = "CONNECT";
    QByteArray peerAddress = d->peerName.isEmpty() ?
                             d->peerAddress.toString().toLatin1() :
                             QUrl::toAce(d->peerName);
    QByteArray path = peerAddress + ':' + QByteArray::number(d->peerPort);
    QByteArray data = method;
    data += ' ';
    data += path;
    data += " HTTP/1.1\r\n";
    data += "Proxy-Connection: keep-alive\r\n";
    data += "Host: " + peerAddress + "\r\n";
    const auto headers = d->proxy.headers();
    if (!headers.contains(QHttpHeaders::WellKnownHeader::UserAgent))
        data += "User-Agent: Mozilla/5.0\r\n";
    for (qsizetype i = 0; i < headers.size(); ++i) {
        const auto name = headers.nameAt(i);
        data += QByteArrayView(name.data(), name.size()) + ": "
                + headers.valueAt(i) + "\r\n";
    }
    QAuthenticatorPrivate *priv = QAuthenticatorPrivate::getPrivate(d->authenticator);
    //qDebug() << "slotSocketConnected: priv=" << priv << (priv ? (int)priv->method : -1);
    if (priv && priv->method != QAuthenticatorPrivate::None) {
        d->credentialsSent = true;
        data += "Proxy-Authorization: " + priv->calculateResponse(method, path, d->proxy.hostName());
        data += "\r\n";
    }
    data += "\r\n";
//     qDebug() << ">>>>>>>> sending request" << this;
//     qDebug() << data;
//     qDebug(">>>>>>>");
    d->socket->write(data);
    d->state = ConnectSent;
}